

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_trie_match(nn_trie *self,uint8_t *data,size_t size)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  nn_trie_node **ppnVar5;
  nn_trie_node *local_40;
  nn_trie_node **tmp;
  nn_trie_node *node;
  size_t size_local;
  uint8_t *data_local;
  nn_trie *self_local;
  
  tmp = (nn_trie_node **)self->root;
  node = (nn_trie_node *)size;
  size_local = (size_t)data;
  while( true ) {
    if (tmp == (nn_trie_node **)0x0) {
      return 0;
    }
    uVar2 = nn_node_check_prefix((nn_trie_node *)tmp,(uint8_t *)size_local,(size_t)node);
    if (uVar2 != *(byte *)((long)tmp + 5)) break;
    puVar4 = (uint8_t *)(size_local + (long)(int)(uint)*(byte *)((long)tmp + 5));
    bVar1 = *(byte *)((long)tmp + 5);
    iVar3 = nn_node_has_subscribers((nn_trie_node *)tmp);
    if (iVar3 != 0) {
      return 1;
    }
    ppnVar5 = nn_node_next((nn_trie_node *)tmp,*puVar4);
    if (ppnVar5 == (nn_trie_node **)0x0) {
      local_40 = (nn_trie_node *)0x0;
    }
    else {
      local_40 = *ppnVar5;
    }
    tmp = (nn_trie_node **)local_40;
    size_local = (size_t)(puVar4 + 1);
    node = (nn_trie_node *)((long)node + (-1 - (ulong)bVar1));
  }
  return 0;
}

Assistant:

int nn_trie_match (struct nn_trie *self, const uint8_t *data, size_t size)
{
    struct nn_trie_node *node;
    struct nn_trie_node **tmp;

    node = self->root;
    while (1) {

        /*  If we are at the end of the trie, return. */
        if (!node)
            return 0;

        /*  Check whether whole prefix matches the data. If not so,
            the whole string won't match. */
        if (nn_node_check_prefix (node, data, size) != node->prefix_len)
            return 0;

        /*  Skip the prefix. */
        data += node->prefix_len;
        size -= node->prefix_len;

        /*  If all the data are matched, return. */
        if (nn_node_has_subscribers (node))
            return 1;

        /*  Move to the next node. */
        tmp = nn_node_next (node, *data);
        node = tmp ? *tmp : NULL;
        ++data;
        --size;
    }
}